

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  pointer ppTVar1;
  TypeEntry *pTVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    ppTVar1 = (this->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar4) {
      return 0xffffffff;
    }
    pTVar2 = ppTVar1[uVar4];
    if (((pTVar2 != (TypeEntry *)0x0) && (pTVar2->kind_ == Func)) &&
       (bVar3 = FuncSignature::operator==((FuncSignature *)(pTVar2 + 1),sig), bVar3)) break;
    uVar4 = uVar4 + 1;
  }
  return (Index)uVar4;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < types.size(); ++i) {
    if (auto* func_type = dyn_cast<FuncType>(types[i])) {
      if (func_type->sig == sig) {
        return i;
      }
    }
  }
  return kInvalidIndex;
}